

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O1

ptr<log_entry> __thiscall nuraft::inmem_log_store::last_entry(inmem_log_store *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  ptr<log_entry> pVar8;
  
  lVar2 = (**(code **)(*in_RSI + 0x10))();
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 7));
  if (iVar1 == 0) {
    uVar6 = lVar2 - 1;
    plVar7 = in_RSI + 2;
    plVar3 = (long *)in_RSI[3];
    plVar4 = plVar7;
    for (plVar5 = plVar3; plVar5 != (long *)0x0;
        plVar5 = (long *)plVar5[(ulong)((ulong)plVar5[4] < uVar6) + 2]) {
      if ((ulong)plVar5[4] >= uVar6) {
        plVar4 = plVar5;
      }
    }
    plVar5 = plVar7;
    if ((plVar4 != plVar7) && (plVar5 = plVar4, uVar6 < (ulong)plVar4[4])) {
      plVar5 = plVar7;
    }
    if (plVar5 == plVar7) {
      for (; plVar3 != (long *)0x0; plVar3 = (long *)plVar3[2]) {
      }
    }
    make_clone((ptr<log_entry> *)this);
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 7));
    pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (ptr<log_entry>)pVar8.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

ptr<log_entry> inmem_log_store::last_entry() const {
    ulong next_idx = next_slot();
    std::lock_guard<std::mutex> l(logs_lock_);
    auto entry = logs_.find( next_idx - 1 );
    if (entry == logs_.end()) {
        entry = logs_.find(0);
    }

    return make_clone(entry->second);
}